

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::PortDeclarationSyntax::setChild
          (PortDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_008c3038 + *(int *)(&DAT_008c3038 + index * 4)))();
  return;
}

Assistant:

void PortDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: header = child.node() ? &child.node()->as<PortHeaderSyntax>() : nullptr; return;
        case 2: declarators = child.node()->as<SeparatedSyntaxList<DeclaratorSyntax>>(); return;
        case 3: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}